

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O2

void __thiscall
cppcms::session_interface::set_session_cookie
          (session_interface *this,int64_t age,string *data,string *key)

{
  bool bVar1;
  bool bVar2;
  bool secure;
  bool httponly;
  bool v;
  bool v_00;
  bool v_01;
  int iVar3;
  size_type sVar4;
  session_interface_cookie_adapter *psVar5;
  cached_settings *pcVar6;
  cached_settings *pcVar7;
  cached_settings *pcVar8;
  time_t tVar9;
  response *this_00;
  ulong uVar10;
  time_t when;
  string cookie_name;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  cookie the_cookie;
  
  sVar4 = data->_M_string_length;
  pcVar6 = cached_settings(this);
  std::__cxx11::string::string((string *)&cookie_name,(string *)&(pcVar6->session).cookies);
  if (key->_M_string_length != 0) {
    std::__cxx11::string::append((char *)&cookie_name);
    std::__cxx11::string::append((string *)&cookie_name);
  }
  pcVar6 = cached_settings(this);
  pcVar7 = cached_settings(this);
  pcVar8 = cached_settings(this);
  iVar3 = (pcVar8->session).cookies.time_shift;
  pcVar8 = cached_settings(this);
  bVar1 = (pcVar8->session).cookies.use_age;
  pcVar8 = cached_settings(this);
  bVar2 = (pcVar8->session).cookies.use_exp;
  pcVar8 = cached_settings(this);
  secure = (pcVar8->session).cookies.secure;
  pcVar8 = cached_settings(this);
  httponly = (pcVar8->session).cookies.httponly;
  pcVar8 = cached_settings(this);
  v = (pcVar8->session).cookies.use_samesite_none;
  pcVar8 = cached_settings(this);
  v_00 = (pcVar8->session).cookies.use_samesite_lax;
  pcVar8 = cached_settings(this);
  v_01 = (pcVar8->session).cookies.use_samesite_strict;
  std::__cxx11::string::string((string *)&local_110,(string *)&cookie_name);
  util::urlencode(&local_130,data);
  std::__cxx11::string::string((string *)&local_150,(string *)&(pcVar7->session).cookies.path);
  std::__cxx11::string::string((string *)&local_170,(string *)&(pcVar6->session).cookies.domain);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  local_190._M_string_length = 0;
  local_190.field_2._M_local_buf[0] = '\0';
  http::cookie::cookie(&the_cookie,&local_110,&local_130,&local_150,&local_170,&local_190);
  uVar10 = -(ulong)(sVar4 == 0) | age;
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  if ((long)uVar10 < 0) {
    if (bVar1 != false) {
      http::cookie::max_age(&the_cookie,0);
    }
    if (bVar2 == false) goto LAB_0023c08f;
    when = 1;
  }
  else {
    if (uVar10 == 0) {
      http::cookie::browser_age(&the_cookie);
      goto LAB_0023c08f;
    }
    if (bVar1 != false) {
      http::cookie::max_age(&the_cookie,(uint)uVar10);
    }
    if (bVar2 == false) goto LAB_0023c08f;
    tVar9 = time((time_t *)0x0);
    when = uVar10 + (long)iVar3 + tVar9;
  }
  http::cookie::expires(&the_cookie,when);
LAB_0023c08f:
  http::cookie::secure(&the_cookie,secure);
  http::cookie::httponly(&the_cookie,httponly);
  http::cookie::samesite_none(&the_cookie,v);
  http::cookie::samesite_lax(&the_cookie,v_00);
  http::cookie::samesite_strict(&the_cookie,v_01);
  psVar5 = ((this->d).ptr_)->adapter;
  if (psVar5 == (session_interface_cookie_adapter *)0x0) {
    this_00 = http::context::response(this->context_);
    http::response::set_cookie(this_00,&the_cookie);
  }
  else {
    (*psVar5->_vptr_session_interface_cookie_adapter[2])(psVar5,&the_cookie);
  }
  http::cookie::~cookie(&the_cookie);
  std::__cxx11::string::~string((string *)&cookie_name);
  return;
}

Assistant:

void session_interface::set_session_cookie(int64_t age,std::string const &data,std::string const &key)
{
	if(data.empty())
		age=-1;
	std::string cookie_name=cached_settings().session.cookies.prefix;
	if(!key.empty()) {
		cookie_name+="_";
		cookie_name+=key;
	}
	std::string const &domain = cached_settings().session.cookies.domain;
	std::string const &path   = cached_settings().session.cookies.path;
	int time_shift = cached_settings().session.cookies.time_shift;
	bool use_age = cached_settings().session.cookies.use_age;
	bool use_exp = cached_settings().session.cookies.use_exp;

	bool secure = cached_settings().session.cookies.secure;
	bool httponly = cached_settings().session.cookies.httponly;
	bool use_samesite_none = cached_settings().session.cookies.use_samesite_none;
	bool use_samesite_lax = cached_settings().session.cookies.use_samesite_lax;
	bool use_samesite_strict = cached_settings().session.cookies.use_samesite_strict;

	http::cookie the_cookie(cookie_name,util::urlencode(data),path,domain);

	if(age < 0) {
		if(use_age)
			the_cookie.max_age(0);
		if(use_exp)
			the_cookie.expires(1);
	}
	else if(age == 0) {
		the_cookie.browser_age();
	}
	else {
		if(use_age)
			the_cookie.max_age(age);
		if(use_exp) {
			the_cookie.expires(age + time(0) + time_shift);
		}
	}

	the_cookie.secure(secure);
	the_cookie.httponly(httponly);
	the_cookie.samesite_none(use_samesite_none);
	the_cookie.samesite_lax(use_samesite_lax);
	the_cookie.samesite_strict(use_samesite_strict);
	
	if(d->adapter)
		d->adapter->set_cookie(the_cookie);
	else
		context_->response().set_cookie(the_cookie);
}